

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# app-template.c
# Opt level: O0

int load_bootstrapping_info(void)

{
  FILE *__stream;
  size_t sVar1;
  int local_13c;
  int local_138;
  int i_3;
  int i_2;
  int i_1;
  size_t lineindex;
  size_t i;
  char *buf_ptr;
  char buf [255];
  char *temp_p;
  FILE *fp;
  
  __stream = fopen("../devices/tutorial_shared_info-63884.txt","r");
  if (__stream == (FILE *)0x0) {
    exit(1);
  }
  _i_2 = 0;
  while( true ) {
    if (3 < _i_2) {
      fclose(__stream);
      printf("Pre-installed ECC Private Key:");
      for (i_3 = 0; i_3 < 0x20; i_3 = i_3 + 1) {
        printf("%02X",(ulong)secp256r1_prv_key_bytes[i_3]);
      }
      printf("\nPre-installed Device Identifier: ");
      printf("%s\nPre-installed ECC Pub Key: ",device_identifier);
      for (local_138 = 0; local_138 < 0x40; local_138 = local_138 + 1) {
        printf("%02X",(ulong)secp256r1_pub_key_bytes[local_138]);
      }
      printf("\nPre-installed Shared Secret: ");
      for (local_13c = 0; local_13c < 0x10; local_13c = local_13c + 1) {
        printf("%02X",(ulong)hmac_key_bytes[local_13c]);
      }
      printf("\n");
      return 0;
    }
    memset(&buf_ptr,0,0xff);
    i = (size_t)&buf_ptr;
    register0x00000000 = fgets((char *)&buf_ptr,0xff,__stream);
    if (register0x00000000 == (char *)0x0) break;
    if (_i_2 == 0) {
      for (lineindex = 0; lineindex < 0x20; lineindex = lineindex + 1) {
        __isoc99_sscanf(i,"%2hhx",secp256r1_prv_key_bytes + lineindex);
        i = i + 2;
      }
    }
    else if (_i_2 == 1) {
      sVar1 = strlen((char *)&buf_ptr);
      *(undefined1 *)((long)&i + sVar1 + 7) = 0;
      strcpy(device_identifier,(char *)&buf_ptr);
    }
    else if (_i_2 == 2) {
      for (lineindex = 0; lineindex < 0x40; lineindex = lineindex + 1) {
        __isoc99_sscanf(i,"%2hhx",secp256r1_pub_key_bytes + lineindex);
        i = i + 2;
      }
    }
    else {
      for (lineindex = 0; lineindex < 0x10; lineindex = lineindex + 1) {
        __isoc99_sscanf(i,"%2hhx",hmac_key_bytes + lineindex);
        i = i + 2;
      }
    }
    _i_2 = _i_2 + 1;
  }
  exit(1);
}

Assistant:

int
load_bootstrapping_info()
{
  FILE * fp;
  char* temp_p;     //To receive the return value of fgets
  char buf[255];
  char* buf_ptr;
  fp = fopen("../devices/tutorial_shared_info-63884.txt", "r");
  if (fp == NULL) exit(1);
  size_t i = 0;
  for (size_t lineindex = 0; lineindex < 4; lineindex++) {
    memset(buf, 0, sizeof(buf));
    buf_ptr = buf;
    temp_p = fgets(buf, sizeof(buf), fp);
    if(temp_p == NULL) exit(1);     //Exit if fgets failed
    if (lineindex == 0) {
      for (i = 0; i < 32; i++) {
        sscanf(buf_ptr, "%2hhx", &secp256r1_prv_key_bytes[i]);
        buf_ptr += 2;
      }
    }
    else if (lineindex == 1) {
      buf[strlen(buf) - 1] = '\0';
      strcpy(device_identifier, buf);
    }
    else if (lineindex == 2) {
      for (i = 0; i < 64; i++) {
        sscanf(buf_ptr, "%2hhx", &secp256r1_pub_key_bytes[i]);
        buf_ptr += 2;
      }
    }
    else {
      for (i = 0; i < 16; i++) {
        sscanf(buf_ptr, "%2hhx", &hmac_key_bytes[i]);
        buf_ptr += 2;
      }
    }
  }
  fclose(fp);

  // prv key
  printf("Pre-installed ECC Private Key:");
  for (int i = 0; i < 32; i++) {
    printf("%02X", secp256r1_prv_key_bytes[i]);
  }
  printf("\nPre-installed Device Identifier: ");
  // device id
  printf("%s\nPre-installed ECC Pub Key: ", device_identifier);
  // pub key
  for (int i = 0; i < 64; i++) {
    printf("%02X", secp256r1_pub_key_bytes[i]);
  }
  printf("\nPre-installed Shared Secret: ");
  // hmac key
  for (int i = 0; i < 16; i++) {
    printf("%02X", hmac_key_bytes[i]);
  }
  printf("\n");
  return 0;
}